

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

int namingConventions::namingConventionsVariables
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  bool bVar1;
  int iVar2;
  AST *pAVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppAVar6;
  char *pcVar7;
  Pda *local_168;
  reference local_160;
  string *oldName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string name;
  uint i;
  undefined1 local_f8 [8];
  vector<AST_*,_std::allocator<AST_*>_> vars;
  string local_d8;
  undefined1 local_b1;
  string local_b0;
  AST *local_80;
  AST *ast;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  string *input;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<Pda_*,_std::allocator<Pda_*>_> varPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputFiles_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<Pda_*,_std::allocator<Pda_*>_>::vector
            ((vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(inputFiles);
  input = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(inputFiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&input), bVar1) {
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ast);
    pAVar3 = (AST *)operator_new(8);
    local_b1 = 1;
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               newVarNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    AST::AST(pAVar3,&local_b0);
    local_b1 = 0;
    std::__cxx11::string::~string((string *)&local_b0);
    local_80 = pAVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"vbn/NamingConvTests/outputs/yeeters.dot",
               (allocator<char> *)
               ((long)&vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    AST::toDot(pAVar3,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pAVar3 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"variable",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
    AST::find((vector<AST_*,_std::allocator<AST_*>_> *)local_f8,pAVar3,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    for (name.field_2._8_4_ = 0; uVar4 = (ulong)(uint)name.field_2._8_4_,
        sVar5 = std::vector<AST_*,_std::allocator<AST_*>_>::size
                          ((vector<AST_*,_std::allocator<AST_*>_> *)local_f8), uVar4 < sVar5;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      ppAVar6 = std::vector<AST_*,_std::allocator<AST_*>_>::operator[]
                          ((vector<AST_*,_std::allocator<AST_*>_> *)local_f8,
                           (ulong)(uint)name.field_2._8_4_);
      AST::yield_abi_cxx11_((string *)&__range2,*ppAVar6);
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&__range2);
      iVar2 = isalpha((int)*pcVar7);
      if ((((iVar2 != 0) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range2,"true"), !bVar1)) &&
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__range2,"false"), !bVar1)) &&
         (bVar1 = findNameInVector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (string *)&__range2), !bVar1)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)&__range2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ast,(value_type *)&__range2);
      }
      std::__cxx11::string::~string((string *)&__range2);
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ast);
    oldName = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ast);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&oldName), bVar1) {
      local_160 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      local_168 = makeNamePda(local_160);
      std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                ((vector<Pda*,std::allocator<Pda*>> *)&__range1,&local_168);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<AST_*,_std::allocator<AST_*>_>::~vector
              ((vector<AST_*,_std::allocator<AST_*>_> *)local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ast);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  adjustForAllFiles(inputFiles,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                    (vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1,false);
  std::vector<Pda_*,_std::allocator<Pda_*>_>::~vector
            ((vector<Pda_*,_std::allocator<Pda_*>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int namingConventions::namingConventionsVariables(const std::vector<std::string> &inputFiles) {

    std::vector<std::string> allVarNames;
    std::vector<Pda *> varPdas;

    // bepaalt via ast alle nieuwe varNames
    for (const std::string &input: inputFiles) {

        std::vector<std::string> newVarNames;

        AST *ast = new AST(input);
        ast->toDot("vbn/NamingConvTests/outputs/yeeters.dot");
        std::vector<AST *> vars = ast->find("variable"); // all found var types

        //update de allVarTypes met de nieuwe var types
        for (unsigned int i = 0; i < vars.size(); ++i) {
            std::string name = vars[i]->yield();
            if(isalpha(name[0])){
              if (!(name == "true" || name == "false") && !findNameInVector(allVarNames, name)) {
                allVarNames.push_back(name);
                newVarNames.push_back(name);
              }
            }

        }

      for (std::string &oldName: newVarNames) {
            varPdas.emplace_back(makeNamePda(oldName));
        }
    }

    // verbetert in alle files de functieNames
    adjustForAllFiles(inputFiles, allVarNames, varPdas, false);

    return 0;
}